

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O0

bool __thiscall
dlib::mfp_kernel_1_base_class<0UL>::
mp_impl_T<dlib::member_function_pointer<void,_void,_void,_void>::mp_impl<dlib::menu_bar>_>::is_same
          (mp_impl_T<dlib::member_function_pointer<void,_void,_void,_void>::mp_impl<dlib::menu_bar>_>
           *this,mp_base_base *item)

{
  mp_impl<dlib::menu_bar> *i;
  mp_base_base *item_local;
  mp_impl_T<dlib::member_function_pointer<void,_void,_void,_void>::mp_impl<dlib::menu_bar>_>
  *this_local;
  bool local_1;
  
  if ((item->o == (void *)0x0) &&
     ((this->super_mp_impl<dlib::menu_bar>).super_mp_base.super_mp_base_base.o == (void *)0x0)) {
    local_1 = true;
  }
  else if ((item->o == (this->super_mp_impl<dlib::menu_bar>).super_mp_base.super_mp_base_base.o) &&
          ((this->super_mp_impl<dlib::menu_bar>).super_mp_base.super_mp_base_base.type == item->type
          )) {
    local_1 = item[1]._vptr_mp_base_base ==
              (_func_int **)(this->super_mp_impl<dlib::menu_bar>).callback &&
              (item[1]._vptr_mp_base_base == (_func_int **)0x0 ||
              item[1].o == *(void **)&(this->super_mp_impl<dlib::menu_bar>).field_0x20);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_same (const mp_base_base* item) const 
            {
                if (item->o == 0 && this->o == 0)
                {
                    return true;
                }
                else if (item->o == this->o && this->type == item->type)
                {
                    const mp_impl* i = reinterpret_cast<const mp_impl*>(item);
                    return (i->callback == this->callback);
                }
                return false;
            }